

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionAccept.cpp
# Opt level: O1

void __thiscall ki::protocol::control::SessionAccept::write_to(SessionAccept *this,ostream *ostream)

{
  Field<int> *pFVar1;
  Field<unsigned_int> *pFVar2;
  Field<unsigned_short> *pFVar3;
  Record record;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  Record local_68;
  
  ki::dml::Record::Record(&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unknown","");
  ki::dml::Record::add_field<unsigned_short>(&local_68,&local_88,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"unknown2","");
  ki::dml::Record::add_field<unsigned_int>(&local_68,&local_a8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"m_timestamp","");
  pFVar1 = ki::dml::Record::add_field<int>(&local_68,&local_c8,true);
  pFVar1->m_value = this->m_timestamp;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"m_milliseconds","");
  pFVar2 = ki::dml::Record::add_field<unsigned_int>(&local_68,&local_e8,true);
  pFVar2->m_value = this->m_milliseconds;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"m_session_id","");
  pFVar3 = ki::dml::Record::add_field<unsigned_short>(&local_68,&local_108,true);
  pFVar3->m_value = this->m_session_id;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  ki::dml::Record::write_to(&local_68,ostream);
  ki::dml::Record::~Record(&local_68);
  return;
}

Assistant:

void SessionAccept::write_to(std::ostream& ostream) const
	{
		dml::Record record;
		record.add_field<dml::USHRT>("unknown");
		record.add_field<dml::UINT>("unknown2");
		record.add_field<dml::INT>("m_timestamp")->set_value(m_timestamp);
		record.add_field<dml::UINT>("m_milliseconds")->set_value(m_milliseconds);
		record.add_field<dml::USHRT>("m_session_id")->set_value(m_session_id);
		record.write_to(ostream);
	}